

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rel-pos.c
# Opt level: O3

int main(int argc,char **argv)

{
  void *pvVar1;
  undefined2 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ggml_tensor *t;
  ggml_tensor *t_00;
  int i;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001244 [12];
  ggml_fp16_t buf_f16 [1024];
  undefined2 local_838;
  undefined1 local_836 [2054];
  
  lVar13 = 0;
  do {
    auVar14._0_4_ = (float)(int)lVar13;
    auVar14._4_12_ = in_register_00001244;
    uVar2 = ggml_fp32_to_fp16(auVar14._0_8_);
    *(undefined2 *)(local_836 + lVar13 * 2 + -2) = uVar2;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x400);
  uVar3 = ggml_init();
  lVar13 = ggml_new_tensor_2d(uVar3,1,3,3);
  pvVar1 = *(void **)(lVar13 + 0xf8);
  sVar4 = ggml_nbytes(lVar13);
  memcpy(pvVar1,&local_838,sVar4);
  lVar5 = ggml_new_tensor_2d(uVar3,1,3,3);
  pvVar1 = *(void **)(lVar5 + 0xf8);
  sVar4 = ggml_nbytes(lVar5);
  memcpy(pvVar1,local_836,sVar4);
  uVar6 = ggml_get_rel_pos(uVar3,lVar13,2,2);
  uVar7 = ggml_get_rel_pos(uVar3,lVar5,2,2);
  uVar8 = ggml_new_tensor_3d(uVar3,0,3,2,2);
  uVar6 = ggml_cpy(uVar3,uVar6,uVar8);
  uVar8 = ggml_new_tensor_3d(uVar3,0,3,2,2);
  uVar7 = ggml_cpy(uVar3,uVar7,uVar8);
  lVar9 = ggml_new_tensor_2d(uVar3,0,9,4);
  lVar10 = ggml_new_tensor_2d(uVar3,0,9,4);
  lVar13 = *(long *)(lVar9 + 0xf8);
  lVar5 = *(long *)(lVar10 + 0xf8);
  lVar11 = ggml_nelements(lVar9);
  if (0 < lVar11) {
    lVar11 = 0;
    do {
      *(undefined4 *)(lVar13 + lVar11 * 4) = 0x3f800000;
      *(undefined4 *)(lVar5 + lVar11 * 4) = 0x3f800000;
      lVar11 = lVar11 + 1;
      lVar12 = ggml_nelements(lVar9);
    } while (lVar11 < lVar12);
  }
  t = (ggml_tensor *)ggml_add_rel_pos(uVar3,lVar9,uVar6,uVar7);
  uVar8 = ggml_new_graph(uVar3);
  ggml_build_forward_expand(uVar8,t);
  ggml_graph_compute_with_ctx(uVar3,uVar8,1);
  t_00 = (ggml_tensor *)ggml_add_rel_pos_inplace(uVar3,lVar10,uVar6,uVar7);
  uVar6 = ggml_new_graph(uVar3);
  ggml_build_forward_expand(uVar6,t_00);
  ggml_graph_compute_with_ctx(uVar3,uVar6,1);
  check_tensor(t,(float *)&DAT_00102030,9,4,1);
  check_tensor(t_00,(float *)&DAT_00102030,9,4,1);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
    ggml_fp16_t buf_f16[1024];
    for (int i = 0; i < 1024; ++i) {
        buf_f16[i] = ggml_fp32_to_fp16((float)i);
    }

    float expected_out[4][9] = {
        { 8.0, 9.0, 10.0, 9.0, 10.0, 11.0, 10.0, 11.0, 12.0 },
        { 2.0, 3.0, 4.0, 3.0, 4.0, 5.0, 4.0, 5.0, 6.0 },
        { 14.0, 15.0, 16.0, 15.0, 16.0, 17.0, 16.0, 17.0, 18.0 },
        { 8.0, 9.0, 10.0, 9.0, 10.0, 11.0, 10.0, 11.0, 12.0 },
    };

    {
        struct ggml_context * ctx = make_ctx();


        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F16, 3, 3);
        ggml_fp16_t* t_d = (ggml_fp16_t*)t->data;
        memcpy(t_d, buf_f16, ggml_nbytes(t));

        struct ggml_tensor * t_2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F16, 3, 3);
        ggml_fp16_t* t_d_2 = (ggml_fp16_t*)t_2->data;
        memcpy(t_d_2, buf_f16 + 1, ggml_nbytes(t_2));

        struct ggml_tensor * rw = ggml_get_rel_pos(ctx, t, 2, 2);
        struct ggml_tensor * rh = ggml_get_rel_pos(ctx, t_2, 2, 2);

        struct ggml_tensor * rw_f32 = ggml_cpy(ctx, rw, ggml_new_tensor_3d(ctx, GGML_TYPE_F32, 3, 2, 2));
        struct ggml_tensor * rh_f32 = ggml_cpy(ctx, rh, ggml_new_tensor_3d(ctx, GGML_TYPE_F32, 3, 2, 2));

        struct ggml_tensor * in = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 9, 4);
        struct ggml_tensor * out_inplace = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 9, 4);
        float * in_d          = (float*)in->data;
        float * out_inplace_d = (float*)out_inplace->data;
        for (int i = 0; i < ggml_nelements(in); ++i) {
            in_d[i]          = 1.f;
            out_inplace_d[i] = 1.f;
        }

        struct ggml_tensor * out = ggml_add_rel_pos(ctx, in, rw_f32, rh_f32);
        struct ggml_cgraph * gf = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf, out);
        ggml_graph_compute_with_ctx(ctx, gf, 1);

        out_inplace = ggml_add_rel_pos_inplace(ctx, out_inplace, rw_f32, rh_f32);
        struct ggml_cgraph * gf_2 = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf_2, out_inplace);
        ggml_graph_compute_with_ctx(ctx, gf_2, 1);

        check_tensor(out, (float*)expected_out, 9, 4, 1);
        check_tensor(out_inplace, (float*)expected_out, 9, 4, 1);
    }

    return 0;
}